

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86.cpp
# Opt level: O2

int __thiscall ncnn::Pooling_x86::create_pipeline(Pooling_x86 *this,Option *param_1)

{
  _func_int **pp_Var1;
  
  pp_Var1 = this->_vptr_Pooling_x86;
  if (*(int *)(&this->field_0x100 + (long)pp_Var1[-3]) != 0) {
    (&this->field_0xb)[(long)pp_Var1[-3]] = 0;
    (&this->field_0xc)[(long)pp_Var1[-3]] = 0;
    (&this->field_0xd)[(long)pp_Var1[-3]] = 0;
    (&this->field_0xe)[(long)pp_Var1[-3]] = 0;
    (&this->field_0x10)[(long)pp_Var1[-3]] = 0;
    (&this->field_0x11)[(long)pp_Var1[-3]] = 0;
  }
  return 0;
}

Assistant:

int Pooling_x86::create_pipeline(const Option& /*opt*/)
{
    if (adaptive_pooling)
    {
        support_packing = false;

        support_bf16_storage = false;
        support_fp16_storage = false;
        support_int8_storage = false;
        support_tensor_storage = false;

        support_weight_fp16_storage = false;
    }
    return 0;
}